

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation<long>
          (ConstantExpression *this,ConstantExpression *result,long *lhs,long *rhs,Operator op)

{
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  Operator in_R8D;
  Error error_1;
  Error error;
  ErrorCode in_stack_fffffffffffffefc;
  Error *in_stack_ffffffffffffff00;
  Error *this_00;
  string local_e0 [16];
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [72];
  long *local_10;
  
  local_10 = in_RSI;
  switch(in_R8D) {
  case ADD:
    (**(code **)(*in_RSI + 0x38))(in_RSI,*in_RDX + *in_RCX);
    break;
  case SUB:
    (**(code **)(*in_RSI + 0x38))(in_RSI,*in_RDX - *in_RCX);
    break;
  case MUL:
    (**(code **)(*in_RSI + 0x38))(in_RSI,*in_RDX * *in_RCX);
    break;
  case DIV:
    if ((*in_RCX == 0) && (*(long *)(in_RDI + 0x38) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Error::Error(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(String *)0xc901e9);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))(*(long **)(in_RDI + 0x38),local_58);
      (**(code **)(*local_10 + 0x30))(0);
      Error::~Error((Error *)0xc90244);
    }
    else {
      (**(code **)(*in_RSI + 0x38))(in_RSI,*in_RDX / *in_RCX,*in_RDX % *in_RCX);
    }
    break;
  default:
    if (*(long *)(in_RDI + 0x38) != 0) {
      ArithmeticExpression::operatorString_abi_cxx11_(in_R8D);
      this_00 = (Error *)local_e0;
      std::operator+((char *)in_stack_ffffffffffffff48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff40);
      Error::Error(this_00,in_stack_fffffffffffffefc,(String *)0xc90325);
      std::__cxx11::string::~string(local_e0);
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))
                (*(long **)(in_RDI + 0x38),&stack0xffffffffffffff40);
      (**(code **)(*local_10 + 0x30))(0);
      Error::~Error((Error *)0xc9036a);
    }
  }
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const T& lhs, const T& rhs, ArithmeticExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::ArithmeticExpression::ADD:
                result.setValue( lhs + rhs );
                return ;

            case AST::ArithmeticExpression::SUB:
                result.setValue( lhs - rhs );
                break;

            case AST::ArithmeticExpression::MUL:
                result.setValue( lhs * rhs );
                break;

            case AST::ArithmeticExpression::DIV:

                if ( rhs == 0 )
                {
                    if ( mErrorHandler )
                    {
                        Error error( Error::ERR_INVALIDPARAMS, "division by zero" );
                        mErrorHandler->handleError( &error );
                        result.setValue( 0. );
                        return;
                    }
                }

                result.setValue( lhs / rhs );
                break;

            default:
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "invalid operator: " + ArithmeticExpression::operatorString( op ) );
                    mErrorHandler->handleError( &error );
                    result.setValue( 0. );
                    return;
                }
            }
        }